

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O3

CollectionPtr __thiscall Jinx::Variant::GetCollection(Variant *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Variant *in_RSI;
  CollectionPtr CVar3;
  Variant v;
  Variant VStack_38;
  
  if (in_RSI->m_type == Collection) {
    *(double *)this = (in_RSI->field_1).m_number;
    p_Var1 = (in_RSI->field_1).m_collection.
             super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->field_1).m_collection.
    super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)p_Var1;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
  }
  else {
    Copy(&VStack_38,in_RSI);
    bVar2 = ConvertTo(&VStack_38,Collection);
    if (bVar2) {
      GetCollection(this);
    }
    else {
      *(undefined8 *)this = 0;
      (this->field_1).m_number = 0.0;
    }
    Destroy(&VStack_38);
    in_RDX._M_pi = extraout_RDX;
  }
  CVar3.
  super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = in_RDX._M_pi;
  CVar3.
  super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (CollectionPtr)
         CVar3.
         super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

inline_t CollectionPtr Variant::GetCollection() const
	{
		if (IsCollection())
			return m_collection;
		Variant v = *this;
		if (!v.ConvertTo(ValueType::Collection))
			return nullptr;
		return v.GetCollection();
	}